

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encrypt0.c
# Opt level: O2

_Bool COSE_Encrypt_Free(HCOSE_ENCRYPT h)

{
  _Bool _Var1;
  
  _Var1 = IsValidEncryptHandle(h);
  if (_Var1) {
    _COSE_Encrypt_Release((COSE_Encrypt *)h);
    _COSE_RemoveFromList(&EncryptRoot,(COSE *)h);
    free(h);
  }
  return _Var1;
}

Assistant:

bool COSE_Encrypt_Free(HCOSE_ENCRYPT h)
{
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context *context;
#endif
	COSE_Encrypt * pEncrypt = (COSE_Encrypt *)h;

	if (!IsValidEncryptHandle(h)) return false;

#ifdef USE_CBOR_CONTEXT
	context = &((COSE_Encrypt *)h)->m_message.m_allocContext;
#endif

	_COSE_Encrypt_Release(pEncrypt);

	_COSE_RemoveFromList(&EncryptRoot, &pEncrypt->m_message);

	COSE_FREE((COSE_Encrypt *)h, context);

	return true;
}